

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLCh *local_20;
  XMLCh *tmpStr;
  XMLCh *authority_local;
  
  local_20 = authority;
  if (authority == (XMLCh *)0x0) {
    authority_local._7_1_ = false;
  }
  else {
    while (*local_20 != L'\0') {
      bVar1 = isUnreservedCharacter(*local_20);
      if ((bVar1) ||
         (iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,*local_20), iVar2 != -1)) {
        local_20 = local_20 + 1;
      }
      else {
        if (*local_20 != L'%') {
          return false;
        }
        XVar3 = XMLString::stringLen(local_20);
        if (((XVar3 < 3) || (bVar1 = XMLString::isHex(local_20[1]), !bVar1)) ||
           (bVar1 = XMLString::isHex(local_20[2]), !bVar1)) {
          return false;
        }
        local_20 = local_20 + 3;
      }
    }
    authority_local._7_1_ = true;
  }
  return authority_local._7_1_;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority)
{
    // check authority
    if (!authority)
        return false;

    const XMLCh* tmpStr = authority;
    while (*tmpStr)
    {
        if (isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr + 1))     // 1st hex
                && XMLString::isHex(*(tmpStr + 2)))  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}